

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

float __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<float,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int *piVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  long lVar7;
  unsigned_fast_type uVar8;
  uint uVar9;
  int iVar10;
  ulong *puVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  local_unsigned_wide_integer_type u;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  
  iVar2 = *(int *)(this + 0x1c);
  local_48 = *(ulong *)(this + 0x10);
  uStack_40 = *(ulong *)(this + 0x18);
  local_58 = *(ulong *)this;
  uStack_50 = *(ulong *)(this + 8);
  if (iVar2 < 0) {
    local_58 = *(ulong *)this ^ 0xffffffffffffffff;
    uStack_50 = *(ulong *)(this + 8) ^ 0xffffffffffffffff;
    local_48 = *(ulong *)(this + 0x10) ^ 0xffffffffffffffff;
    uStack_40 = *(ulong *)(this + 0x18) ^ 0xffffffffffffffff;
    lVar6 = 0;
    do {
      piVar1 = (int *)((long)&local_58 + lVar6);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar14 = lVar6 != 0x1c;
      lVar6 = lVar6 + 4;
    } while (bVar14);
  }
  local_28 = local_48;
  uStack_20 = uStack_40;
  local_38 = local_58;
  uStack_30 = uStack_50;
  iVar13 = 8;
  lVar6 = 0;
  do {
    lVar7 = lVar6;
    if (lVar7 == -0x20) {
      uVar9 = 1;
      goto LAB_00130265;
    }
    iVar13 = iVar13 + -1;
    lVar6 = lVar7 + -4;
  } while (*(int *)((long)&uStack_20 + lVar7 + 4) == 0);
  uVar8 = detail::msb_helper<unsigned_int>((uint32_t *)((long)&uStack_20 + lVar7 + 4));
  uVar9 = (int)uVar8 + iVar13 * 0x20 + 1;
LAB_00130265:
  iVar13 = (uint)((uVar9 & 0x1f) != 0) + (uVar9 >> 5);
  if (iVar13 == 0) {
    fVar15 = 0.0;
  }
  else {
    iVar10 = 0;
    puVar11 = &local_38;
    fVar5 = 1.0;
    fVar15 = 0.0;
    do {
      uVar9 = 1;
      iVar12 = 0x20;
      fVar4 = 0.0;
      do {
        fVar3 = fVar4 + fVar5;
        if (((uint)*puVar11 & uVar9) == 0) {
          fVar3 = fVar4;
        }
        uVar9 = uVar9 * 2;
        fVar5 = fVar5 + fVar5;
        iVar12 = iVar12 + -1;
        fVar4 = fVar3;
      } while (iVar12 != 0);
      fVar15 = fVar15 + fVar3;
      puVar11 = (ulong *)((long)puVar11 + 4);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar13);
  }
  if (iVar2 < 0) {
    fVar15 = -fVar15;
  }
  return fVar15;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }